

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifDec16.c
# Opt level: O3

void If_CluPrintConfig(int nVars,If_Grp_t *g,If_Grp_t *r,word BStruth,word *pFStruth)

{
  byte bVar1;
  byte bVar2;
  uint uVar3;
  ulong uVar4;
  uint uVar5;
  uint uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong local_28;
  
  local_28 = BStruth;
  if ((nVars - g->nVars) + (uint)('\x02' < g->nMyu) + 1 != (int)r->nVars) {
    __assert_fail("r->nVars == nVars - g->nVars + 1 + (g->nMyu > 2)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifDec16.c"
                  ,0x250,"void If_CluPrintConfig(int, If_Grp_t *, If_Grp_t *, word, word *)");
  }
  If_CluPrintGroup(g);
  bVar1 = g->nVars;
  uVar5 = (uint)(char)bVar1;
  if ((int)uVar5 < 6) {
    if (6 < bVar1) goto LAB_00416b9a;
    bVar2 = (byte)(1L << (bVar1 & 0x3f));
    uVar7 = ~(-1L << (bVar2 & 0x3f)) & BStruth;
    uVar4 = 0;
    uVar8 = uVar7 << (bVar2 & 0x3f);
    if (bVar1 != 0) {
      uVar8 = uVar4;
    }
    uVar8 = uVar8 | uVar7;
    uVar7 = uVar8 * 4;
    if (1 < bVar1) {
      uVar7 = uVar4;
    }
    uVar7 = uVar7 | uVar8;
    uVar6 = 2;
    if (2 < uVar5) {
      uVar6 = uVar5;
    }
    uVar8 = uVar7 << 4;
    if (2 < bVar1) {
      uVar8 = uVar4;
    }
    uVar3 = 3;
    if (2 < bVar1) {
      uVar3 = uVar6;
    }
    uVar8 = uVar8 | uVar7;
    uVar7 = uVar8 << 8;
    if (uVar3 != 3) {
      uVar7 = uVar4;
    }
    uVar7 = uVar7 | uVar8;
    uVar8 = uVar7 << 0x10;
    if (1 < uVar3 - 3) {
      uVar8 = uVar4;
    }
    uVar8 = uVar8 | uVar7;
    local_28 = uVar8 << 0x20 | uVar8;
  }
  Kit_DsdPrintFromTruth((uint *)&local_28,uVar5);
  putchar(10);
  If_CluPrintGroup(r);
  bVar1 = r->nVars;
  uVar5 = (uint)(char)bVar1;
  if ((int)uVar5 < 6) {
    if (6 < bVar1) {
LAB_00416b9a:
      __assert_fail("nVars >= 0 && nVars <= 6",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifDec16.c"
                    ,0x174,"word If_CluAdjust(word, int)");
    }
    bVar2 = (byte)(1L << (bVar1 & 0x3f));
    uVar7 = ~(-1L << (bVar2 & 0x3f)) & *pFStruth;
    uVar4 = 0;
    uVar8 = uVar7 << (bVar2 & 0x3f);
    if (bVar1 != 0) {
      uVar8 = uVar4;
    }
    uVar8 = uVar8 | uVar7;
    uVar7 = uVar8 * 4;
    if (1 < bVar1) {
      uVar7 = uVar4;
    }
    uVar7 = uVar7 | uVar8;
    uVar6 = 2;
    if (2 < uVar5) {
      uVar6 = uVar5;
    }
    uVar8 = uVar7 << 4;
    if (2 < bVar1) {
      uVar8 = uVar4;
    }
    uVar3 = 3;
    if (2 < bVar1) {
      uVar3 = uVar6;
    }
    uVar8 = uVar8 | uVar7;
    uVar7 = uVar8 << 8;
    if (uVar3 != 3) {
      uVar7 = uVar4;
    }
    uVar7 = uVar7 | uVar8;
    uVar8 = uVar7 << 0x10;
    if (1 < uVar3 - 3) {
      uVar8 = uVar4;
    }
    uVar8 = uVar8 | uVar7;
    *pFStruth = uVar8 << 0x20 | uVar8;
  }
  Kit_DsdPrintFromTruth((uint *)pFStruth,uVar5);
  putchar(10);
  return;
}

Assistant:

void If_CluPrintConfig( int nVars, If_Grp_t * g, If_Grp_t * r, word BStruth, word * pFStruth )
{
    assert( r->nVars == nVars - g->nVars + 1 + (g->nMyu > 2) );
    If_CluPrintGroup( g );
    if ( g->nVars < 6 )
        BStruth = If_CluAdjust( BStruth, g->nVars );
    Kit_DsdPrintFromTruth( (unsigned *)&BStruth, g->nVars );
    printf( "\n" );
    If_CluPrintGroup( r );
    if ( r->nVars < 6 )
        pFStruth[0] = If_CluAdjust( pFStruth[0], r->nVars );
    Kit_DsdPrintFromTruth( (unsigned *)pFStruth, r->nVars );
    printf( "\n" );
}